

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * __thiscall RPCArg::ToStringObj_abi_cxx11_(RPCArg *this,bool oneline)

{
  long lVar1;
  string_view file;
  string_view file_00;
  string_view msg;
  string_view msg_00;
  string_view func;
  string_view func_00;
  byte bVar2;
  bool bVar3;
  NonFatalCheckError *this_00;
  undefined8 uVar4;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  byte in_DL;
  char *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  RPCArg *i;
  vector<RPCArg,_std::allocator<RPCArg>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  RPCArg *in_stack_fffffffffffffe80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined8 uVar5;
  int iVar6;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4 [12];
  undefined7 in_stack_fffffffffffffef0;
  char *pcVar7;
  RPCArg *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff9f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  pcVar7 = in_RSI;
  std::__cxx11::string::string(&in_stack_fffffffffffffe80->m_names);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  GetFirstName_abi_cxx11_(in_stack_fffffffffffffe80);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(in_stack_fffffffffffffe68);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  }
  this_00 = (NonFatalCheckError *)(ulong)*(uint *)(in_RSI + 0x20);
  switch(this_00) {
  case (NonFatalCheckError *)0x0:
  case (NonFatalCheckError *)0x5:
  case (NonFatalCheckError *)0x6:
    uVar4 = __cxa_allocate_exception(0x10);
    uVar5 = uVar4;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
    msg._M_len._7_1_ = bVar2;
    msg._M_len._0_7_ = in_stack_fffffffffffffef0;
    msg._M_str = pcVar7;
    file._4_12_ = in_stack_fffffffffffffee4;
    file._M_len._0_4_ = in_stack_fffffffffffffee0;
    func._M_str = in_stack_ffffffffffffff38;
    func._M_len = in_stack_ffffffffffffff30;
    NonFatalCheckError::NonFatalCheckError(this_00,msg,file,iVar6,func);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar4,&NonFatalCheckError::typeinfo,NonFatalCheckError::~NonFatalCheckError);
    }
    goto LAB_00e53550;
  case (NonFatalCheckError *)0x1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    std::vector<RPCArg,_std::allocator<RPCArg>_>::begin
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffe70);
    std::vector<RPCArg,_std::allocator<RPCArg>_>::end
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffe70);
    while (bVar3 = __gnu_cxx::
                   operator==<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                             ((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                               *)in_stack_fffffffffffffe78,
                              (__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                               *)in_stack_fffffffffffffe70), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
      operator*((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *)
                in_stack_fffffffffffffe68);
      ToString_abi_cxx11_(in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff9f);
      std::operator+(&in_stack_fffffffffffffe80->m_names,(char *)in_stack_fffffffffffffe78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
      operator++((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *
                 )in_stack_fffffffffffffe68);
    }
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case (NonFatalCheckError *)0x2:
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case (NonFatalCheckError *)0x3:
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case (NonFatalCheckError *)0x4:
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case (NonFatalCheckError *)0x7:
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case (NonFatalCheckError *)0x8:
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case (NonFatalCheckError *)0x9:
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  default:
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x10);
    iVar6 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,(char *)in_stack_fffffffffffffe80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,(char *)in_stack_fffffffffffffe80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,(char *)in_stack_fffffffffffffe80);
    msg_00._M_len._7_1_ = bVar2;
    msg_00._M_len._0_7_ = in_stack_fffffffffffffef0;
    msg_00._M_str = pcVar7;
    file_00._4_12_ = in_stack_fffffffffffffee4;
    file_00._M_len._0_4_ = in_stack_fffffffffffffee0;
    func_00._M_str = in_stack_ffffffffffffff38;
    func_00._M_len = in_stack_ffffffffffffff30;
    NonFatalCheckError::NonFatalCheckError(this_00,msg_00,file_00,iVar6,func_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_01,&NonFatalCheckError::typeinfo,NonFatalCheckError::~NonFatalCheckError);
    }
    goto LAB_00e53550;
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
LAB_00e53550:
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::ToStringObj(const bool oneline) const
{
    std::string res;
    res += "\"";
    res += GetFirstName();
    if (oneline) {
        res += "\":";
    } else {
        res += "\": ";
    }
    switch (m_type) {
    case Type::STR:
        return res + "\"str\"";
    case Type::STR_HEX:
        return res + "\"hex\"";
    case Type::NUM:
        return res + "n";
    case Type::RANGE:
        return res + "n or [n,n]";
    case Type::AMOUNT:
        return res + "amount";
    case Type::BOOL:
        return res + "bool";
    case Type::ARR:
        res += "[";
        for (const auto& i : m_inner) {
            res += i.ToString(oneline) + ",";
        }
        return res + "...]";
    case Type::OBJ:
    case Type::OBJ_NAMED_PARAMS:
    case Type::OBJ_USER_KEYS:
        // Currently unused, so avoid writing dead code
        NONFATAL_UNREACHABLE();
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}